

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O1

void __thiscall lora_merge_ctx::copy_tensor(lora_merge_ctx *this,ggml_tensor *base)

{
  char *__s;
  long lVar1;
  size_t sVar2;
  char zero;
  string local_68;
  string local_48;
  
  __s = base->name;
  ggml_ne_string_abi_cxx11_(&local_48,base);
  printf("%s :  %s [%s]\n","copy_tensor",__s,
         CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  lVar1 = ggml_nbytes(base);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar2);
  file_input::read_tensor_data(&this->base_model,&local_68,&this->read_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::ostream::write((char *)&this->fout,
                      (long)(this->read_buf).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  local_48._M_dataplus._M_p._0_1_ = 0;
  lVar1 = lVar1 - (lVar1 + 0x1fU & 0xffffffffffffffe0);
  if (lVar1 != 0) {
    do {
      std::ostream::write((char *)&this->fout,(long)&local_48);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void copy_tensor(struct ggml_tensor * base) {
        printf("%s :  %s [%s]\n", __func__, base->name, ggml_ne_string(base).c_str());
        size_t len = ggml_nbytes(base);
        base_model.read_tensor_data(base->name, read_buf);
        fout.write((char* )read_buf.data(), len);
        zeros(fout, GGML_PAD(len, GGUF_DEFAULT_ALIGNMENT) - len);
    }